

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.h
# Opt level: O2

pair<mjs::object::property_*,_mjs::gc_vector<mjs::object::property>_*> __thiscall
mjs::object::find(object *this,wstring_view key)

{
  bool bVar1;
  gc_vector<mjs::object::property> *this_00;
  gc_table *this_01;
  gc_table *pgVar2;
  gc_vector<mjs::object::property> *__range2;
  property *p;
  pair<mjs::object::property_*,_mjs::gc_vector<mjs::object::property>_*> pVar3;
  
  this_00 = gc_heap_ptr_untracked<mjs::gc_vector<mjs::object::property>,_true>::dereference
                      (&this->properties_,this->heap_);
  this_01 = gc_vector<mjs::object::property>::tab(this_00);
  pgVar2 = (gc_table *)gc_vector<mjs::object::property>::end(this_00);
  do {
    this_01 = this_01 + 1;
    if (this_01 == pgVar2) {
      this_01 = (gc_table *)0x0;
      break;
    }
    bVar1 = property::key_matches((property *)this_01,this->heap_,key);
  } while (!bVar1);
  pVar3.second = this_00;
  pVar3.first = (property *)this_01;
  return pVar3;
}

Assistant:

std::pair<property*, gc_vector<property>*> find(const std::wstring_view key) const {
        auto& props = properties_.dereference(heap_);
        for (auto& p: props) {
            if (p.key_matches(heap_, key)) {
                return { &p, &props };
            }
        }
        return {nullptr, &props};
    }